

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

int doing_getsock(Curl_easy *data,curl_socket_t *socks)

{
  connectdata *pcVar1;
  _func_int_Curl_easy_ptr_connectdata_ptr_curl_socket_t_ptr *UNRECOVERED_JUMPTABLE;
  int iVar2;
  
  pcVar1 = data->conn;
  iVar2 = 0;
  if (pcVar1 != (connectdata *)0x0) {
    UNRECOVERED_JUMPTABLE = pcVar1->handler->doing_getsock;
    if (UNRECOVERED_JUMPTABLE != (_func_int_Curl_easy_ptr_connectdata_ptr_curl_socket_t_ptr *)0x0) {
      iVar2 = (*UNRECOVERED_JUMPTABLE)(data,pcVar1,socks);
      return iVar2;
    }
    if (pcVar1->sockfd != -1) {
      *socks = pcVar1->sockfd;
      iVar2 = 0x10000;
    }
  }
  return iVar2;
}

Assistant:

static int doing_getsock(struct Curl_easy *data, curl_socket_t *socks)
{
  struct connectdata *conn = data->conn;
  if(conn && conn->handler->doing_getsock)
    return conn->handler->doing_getsock(data, conn, socks);
  else if(conn && conn->sockfd != CURL_SOCKET_BAD) {
    /* Default is that we want to send something to the server */
    socks[0] = conn->sockfd;
    return GETSOCK_WRITESOCK(0);
  }
  return GETSOCK_BLANK;
}